

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int termIsEquivalence(Parse *pParse,Expr *pExpr)

{
  char cVar1;
  char cVar2;
  int iVar3;
  CollSeq *p;
  CollSeq *pColl;
  char aff2;
  char aff1;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  if ((pParse->db->dbOptFlags & 0x80) == 0) {
    if ((pExpr->op == '5') || (pExpr->op == '-')) {
      if ((pExpr->flags & 1) == 0) {
        cVar1 = sqlite3ExprAffinity(pExpr->pLeft);
        cVar2 = sqlite3ExprAffinity(pExpr->pRight);
        if ((cVar1 == cVar2) || (('B' < cVar1 && ('B' < cVar2)))) {
          p = sqlite3BinaryCompareCollSeq(pParse,pExpr->pLeft,pExpr->pRight);
          iVar3 = sqlite3IsBinary(p);
          if (iVar3 == 0) {
            pParse_local._4_4_ = sqlite3ExprCollSeqMatch(pParse,pExpr->pLeft,pExpr->pRight);
          }
          else {
            pParse_local._4_4_ = 1;
          }
        }
        else {
          pParse_local._4_4_ = 0;
        }
      }
      else {
        pParse_local._4_4_ = 0;
      }
    }
    else {
      pParse_local._4_4_ = 0;
    }
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int termIsEquivalence(Parse *pParse, Expr *pExpr){
  char aff1, aff2;
  CollSeq *pColl;
  if( !OptimizationEnabled(pParse->db, SQLITE_Transitive) ) return 0;
  if( pExpr->op!=TK_EQ && pExpr->op!=TK_IS ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin) ) return 0;
  aff1 = sqlite3ExprAffinity(pExpr->pLeft);
  aff2 = sqlite3ExprAffinity(pExpr->pRight);
  if( aff1!=aff2
   && (!sqlite3IsNumericAffinity(aff1) || !sqlite3IsNumericAffinity(aff2))
  ){
    return 0;
  }
  pColl = sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft, pExpr->pRight);
  if( sqlite3IsBinary(pColl) ) return 1;
  return sqlite3ExprCollSeqMatch(pParse, pExpr->pLeft, pExpr->pRight);
}